

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::decoder_etc_block::get_block_colors5
               (color32 *pBlock_colors,color32 *base_color5,uint32_t inten_table)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int *piVar8;
  long lVar9;
  uint in_EDX;
  uint *in_RSI;
  color32 *in_RDI;
  int *pInten_table;
  color32 b;
  char local_18;
  byte bStack_17;
  byte bStack_16;
  
  uVar1 = *in_RSI;
  local_18 = (char)uVar1;
  bVar2 = local_18 << 3 | (byte)((int)(uVar1 & 0xff) >> 2);
  bStack_17 = (byte)(uVar1 >> 8);
  bVar3 = bStack_17 << 3 | (byte)((int)(uint)bStack_17 >> 2);
  bStack_16 = (byte)(uVar1 >> 0x10);
  bVar4 = bStack_16 << 3 | (byte)((int)(uint)bStack_16 >> 2);
  lVar9 = (ulong)in_EDX * 0x10;
  piVar8 = (int *)(g_etc1_inten_tables + lVar9);
  uVar5 = clamp255((uint)bVar2 + *piVar8);
  uVar6 = clamp255((uint)bVar3 + *piVar8);
  uVar7 = clamp255((uint)bVar4 + *piVar8);
  color32::set(in_RDI,uVar5,uVar6,uVar7,0xff);
  uVar5 = clamp255((uint)bVar2 + *(int *)(g_etc1_inten_tables + lVar9 + 4));
  uVar6 = clamp255((uint)bVar3 + *(int *)(g_etc1_inten_tables + lVar9 + 4));
  uVar7 = clamp255((uint)bVar4 + *(int *)(g_etc1_inten_tables + lVar9 + 4));
  color32::set(in_RDI + 1,uVar5,uVar6,uVar7,0xff);
  uVar5 = clamp255((uint)bVar2 + *(int *)(g_etc1_inten_tables + lVar9 + 8));
  uVar6 = clamp255((uint)bVar3 + *(int *)(g_etc1_inten_tables + lVar9 + 8));
  uVar7 = clamp255((uint)bVar4 + *(int *)(g_etc1_inten_tables + lVar9 + 8));
  color32::set(in_RDI + 2,uVar5,uVar6,uVar7,0xff);
  uVar5 = clamp255((uint)bVar2 + *(int *)(g_etc1_inten_tables + lVar9 + 0xc));
  uVar6 = clamp255((uint)bVar3 + *(int *)(g_etc1_inten_tables + lVar9 + 0xc));
  uVar7 = clamp255((uint)bVar4 + *(int *)(g_etc1_inten_tables + lVar9 + 0xc));
  color32::set(in_RDI + 3,uVar5,uVar6,uVar7,0xff);
  return;
}

Assistant:

static void get_block_colors5(color32* pBlock_colors, const color32& base_color5, uint32_t inten_table)
		{
			color32 b(base_color5);

			b.r = (b.r << 3) | (b.r >> 2);
			b.g = (b.g << 3) | (b.g >> 2);
			b.b = (b.b << 3) | (b.b >> 2);

			const int* pInten_table = g_etc1_inten_tables[inten_table];

			pBlock_colors[0].set(clamp255(b.r + pInten_table[0]), clamp255(b.g + pInten_table[0]), clamp255(b.b + pInten_table[0]), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[1]), clamp255(b.g + pInten_table[1]), clamp255(b.b + pInten_table[1]), 255);
			pBlock_colors[2].set(clamp255(b.r + pInten_table[2]), clamp255(b.g + pInten_table[2]), clamp255(b.b + pInten_table[2]), 255);
			pBlock_colors[3].set(clamp255(b.r + pInten_table[3]), clamp255(b.g + pInten_table[3]), clamp255(b.b + pInten_table[3]), 255);
		}